

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fireworks.cpp
# Opt level: O2

bool __thiscall Fireworks::displayAnimation(Fireworks *this,Screen *screen)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int explosionColor;
  int iVar5;
  int iVar6;
  int iVar7;
  Firework firework3;
  Firework firework2;
  Firework firework1;
  
  Screen::startAnimation(screen);
  iVar2 = Screen::createColor(screen,3,0);
  iVar3 = Screen::createColor(screen,6,0);
  iVar4 = Screen::createColor(screen,2,0);
  explosionColor = Screen::createColor(screen,5,0);
  Firework::Firework(&firework1,'o','|',':','.');
  Firework::Firework(&firework2,'o','|',':','x');
  Firework::Firework(&firework3,'o','|',':','.');
  iVar5 = Screen::getScreenSizeX(screen);
  iVar6 = Screen::getScreenSizeY(screen);
  iVar7 = 0xc;
  Firework::initializeFirework(&firework1,iVar5 / 4,iVar6 / 2,0xc,iVar2,iVar3,screen);
  iVar3 = Screen::getScreenSizeX(screen);
  iVar5 = Screen::getScreenSizeY(screen);
  Firework::initializeFirework(&firework2,(iVar3 / 4) * 3,iVar5 / 2,0xe,iVar2,iVar4,screen);
  iVar3 = Screen::getScreenSizeX(screen);
  iVar4 = Screen::getScreenSizeY(screen);
  Firework::initializeFirework(&firework3,iVar3 / 2,iVar4 / 2,0x10,iVar2,explosionColor,screen);
  bVar1 = true;
  iVar2 = 0x18;
  while (bVar1 != false) {
    Screen::clearScreen(screen);
    bVar1 = Firework::display(&firework1,screen);
    if (iVar7 < 1) {
      bVar1 = Firework::display(&firework2,screen);
    }
    else {
      iVar7 = iVar7 + -1;
    }
    if (iVar2 < 1) {
      bVar1 = Firework::display(&firework3,screen);
    }
    else {
      iVar2 = iVar2 + -1;
    }
    Screen::refreshScreen(screen);
    usleep(0xa2c2);
  }
  Screen::endAnimation(screen);
  Firework::~Firework(&firework3);
  Firework::~Firework(&firework2);
  Firework::~Firework(&firework1);
  return true;
}

Assistant:

bool Fireworks::displayAnimation(Screen &screen){

    screen.startAnimation();

    // Create the colors
    int streamerColor = screen.createColor(COLOR_YELLOW, COLOR_BLACK);
    int explosionColors[3];
    explosionColors[0] = screen.createColor(COLOR_CYAN, COLOR_BLACK);
    explosionColors[1] = screen.createColor(COLOR_GREEN, COLOR_BLACK);
    explosionColors[2] = screen.createColor(COLOR_MAGENTA, COLOR_BLACK);
    Firework firework1('o', '|', ':', '.');
    Firework firework2('o', '|', ':', 'x');
    Firework firework3('o', '|', ':', '.');

    firework1.initializeFirework(screen.getScreenSizeX() / 4,
                                 screen.getScreenSizeY() / 2,
                                 12,
                                 streamerColor,
                                 explosionColors[0],
                                 screen);

    firework2.initializeFirework(screen.getScreenSizeX() / 4 * 3,
                                 screen.getScreenSizeY() / 2,
                                 14,
                                 streamerColor,
                                 explosionColors[1],
                                 screen);
    firework3.initializeFirework(screen.getScreenSizeX() / 2,
                                 screen.getScreenSizeY() / 2,
                                 16,
                                 streamerColor,
                                 explosionColors[2],
                                 screen);

    // Set the delay between the two fireworks
    int delay1 = 1 * FRAMES_PER_SECOND / 2;
    int delay2 = delay1 * 2;
    bool activeFireworkFlag = true;

    // Loop until both fireworks are done displaying
    while (activeFireworkFlag){
        screen.clearScreen();
        activeFireworkFlag = firework1.display(screen);

        // Delay the second firework
        if (delay1 > 0){
            delay1 --;
        }
        else {
            activeFireworkFlag = firework2.display(screen);
        }

        if(delay2 > 0){
            delay2--;
        }
        else {
            activeFireworkFlag = firework3.display(screen);
        }

        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND);
    }


    screen.endAnimation();
    return true;
}